

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
checkInterfacePropertyCompatibility<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,cmGeneratorTarget *tgt,string *p,string *config,char *defaultValue,CompatibleType t,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_6)

{
  pointer tgt_00;
  CompatibleType CVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *this;
  string *psVar5;
  reference ppcVar6;
  pointer genexInterpreter_00;
  ostream *poVar7;
  byte local_83c;
  byte local_83b;
  string local_828;
  string local_808;
  string local_7e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8;
  string local_7a8;
  undefined1 local_788 [8];
  ostringstream e_2;
  string local_610;
  undefined1 local_5f0 [8];
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  consistent_2;
  undefined1 local_5a8 [8];
  ostringstream e_1;
  string local_430;
  undefined1 local_410 [8];
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  consistent_1;
  string local_3c8;
  string local_3a8;
  undefined1 local_388 [8];
  ostringstream e;
  string local_210;
  undefined1 local_1f0 [8];
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  consistent;
  string local_1a8;
  undefined1 local_188 [8];
  string reportEntry;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ifacePropContent;
  undefined1 local_140 [7];
  bool ifaceIsSet;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propKeys;
  cmGeneratorTarget *theTarget;
  const_iterator __end1;
  const_iterator __begin1;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *__range1;
  unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
  local_100;
  unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
  local_f8;
  unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
  genexInterpreter;
  string interfaceProperty;
  string local_b0;
  undefined1 local_90 [8];
  string report;
  bool propInitialized;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *deps;
  bool impliedByUse;
  bool explicitlySet;
  undefined1 local_50 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headPropKeys;
  CompatibleType t_local;
  char *defaultValue_local;
  string *config_local;
  string *p_local;
  cmGeneratorTarget *tgt_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *propContent;
  
  headPropKeys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
  headPropKeys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = t;
  getTypedProperty<std::__cxx11::string>
            (__return_storage_ptr__,tgt,p,(cmGeneratorExpressionInterpreter *)0x0);
  cmGeneratorTarget::GetPropertyKeys_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_50,tgt);
  bVar2 = cm::
          contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_50,p);
  bVar3 = cmGeneratorTarget::IsNullImpliedByLinkLibraries(tgt,p);
  local_83b = 1;
  if (bVar3 == bVar2) {
    local_83c = 0;
    if (!bVar3) {
      local_83c = bVar2 ^ 0xff;
    }
    local_83b = local_83c;
  }
  if ((local_83b & 1) == 0) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x18d2,
                  "PropertyType checkInterfacePropertyCompatibility(const cmGeneratorTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = std::basic_string<char>]"
                 );
  }
  this = cmGeneratorTarget::GetLinkImplementationClosure(tgt,config);
  bVar4 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::empty
                    (this);
  if (bVar4) {
    headPropKeys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
    report.field_2._12_4_ = 1;
  }
  else {
    report.field_2._M_local_buf[0xb] = bVar2;
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
    cmStrCat<char_const(&)[12],std::__cxx11::string_const&>
              ((string *)local_90,(char (*) [12])" * Target \"",psVar5);
    if (bVar2) {
      std::__cxx11::string::operator+=((string *)local_90,"\" has property content \"");
      std::__cxx11::string::string
                ((string *)(interfaceProperty.field_2._M_local_buf + 8),
                 (string *)__return_storage_ptr__);
      valueAsString<std::__cxx11::string>
                (&local_b0,(string *)((long)&interfaceProperty.field_2 + 8));
      std::__cxx11::string::operator+=((string *)local_90,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)(interfaceProperty.field_2._M_local_buf + 8));
      std::__cxx11::string::operator+=((string *)local_90,"\"\n");
    }
    else if (bVar3) {
      std::__cxx11::string::operator+=((string *)local_90,"\" property is implied by use.\n");
    }
    else {
      std::__cxx11::string::operator+=((string *)local_90,"\" property not set.\n");
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &genexInterpreter,"INTERFACE_",p);
    std::
    unique_ptr<cmGeneratorExpressionInterpreter,std::default_delete<cmGeneratorExpressionInterpreter>>
    ::unique_ptr<std::default_delete<cmGeneratorExpressionInterpreter>,void>
              ((unique_ptr<cmGeneratorExpressionInterpreter,std::default_delete<cmGeneratorExpressionInterpreter>>
                *)&local_f8);
    bVar4 = std::operator==(p,"POSITION_INDEPENDENT_CODE");
    if (bVar4) {
      __range1 = (vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *)
                 cmGeneratorTarget::GetLocalGenerator(tgt);
      std::
      make_unique<cmGeneratorExpressionInterpreter,cmLocalGenerator*,std::__cxx11::string_const&,cmGeneratorTarget_const*&>
                ((cmLocalGenerator **)&local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                 (cmGeneratorTarget **)config);
      std::
      unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
      ::operator=(&local_f8,&local_100);
      std::
      unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
      ::~unique_ptr(&local_100);
    }
    __end1 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
             begin(this);
    theTarget = (cmGeneratorTarget *)
                std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
                end(this);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                                       *)&theTarget), bVar4) {
      ppcVar6 = __gnu_cxx::
                __normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                ::operator*(&__end1);
      propKeys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppcVar6;
      cmGeneratorTarget::GetPropertyKeys_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_140,
                 (cmGeneratorTarget *)
                 propKeys.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar4 = cm::
              contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_140,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &genexInterpreter);
      tgt_00 = propKeys.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      genexInterpreter_00 =
           std::
           unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
           ::get(&local_f8);
      getTypedProperty<std::__cxx11::string>
                ((string *)((long)&reportEntry.field_2 + 8),(cmGeneratorTarget *)tgt_00,
                 (string *)&genexInterpreter,genexInterpreter_00);
      std::__cxx11::string::string((string *)local_188);
      if (bVar4) {
        std::__cxx11::string::operator+=((string *)local_188," * Target \"");
        psVar5 = cmGeneratorTarget::GetName_abi_cxx11_
                           ((cmGeneratorTarget *)
                            propKeys.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::operator+=((string *)local_188,(string *)psVar5);
        std::__cxx11::string::operator+=((string *)local_188,"\" property value \"");
        std::__cxx11::string::string
                  ((string *)(consistent.second.field_2._M_local_buf + 8),
                   (string *)(reportEntry.field_2._M_local_buf + 8));
        valueAsString<std::__cxx11::string>
                  (&local_1a8,(string *)((long)&consistent.second.field_2 + 8));
        std::__cxx11::string::operator+=((string *)local_188,(string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::__cxx11::string::~string((string *)(consistent.second.field_2._M_local_buf + 8));
        std::__cxx11::string::operator+=((string *)local_188,"\" ");
      }
      if (bVar2) {
        if (bVar4) {
          consistentProperty((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_1f0,__return_storage_ptr__,
                             (string *)((long)&reportEntry.field_2 + 8),
                             headPropKeys.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          std::__cxx11::string::operator+=((string *)local_90,(string *)local_188);
          CVar1 = headPropKeys.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          bVar4 = std::operator!=(__return_storage_ptr__,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&consistent);
          compatibilityAgree_abi_cxx11_(&local_210,CVar1,bVar4);
          std::__cxx11::string::operator+=((string *)local_90,(string *)&local_210);
          std::__cxx11::string::~string((string *)&local_210);
          if ((local_1f0[0] & 1U) == 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_388);
            poVar7 = std::operator<<((ostream *)local_388,"Property ");
            poVar7 = std::operator<<(poVar7,(string *)p);
            poVar7 = std::operator<<(poVar7," on target \"");
            psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
            poVar7 = std::operator<<(poVar7,(string *)psVar5);
            poVar7 = std::operator<<(poVar7,"\" does\nnot match the INTERFACE_");
            poVar7 = std::operator<<(poVar7,(string *)p);
            poVar7 = std::operator<<(poVar7," property requirement\nof dependency \"");
            psVar5 = cmGeneratorTarget::GetName_abi_cxx11_
                               ((cmGeneratorTarget *)
                                propKeys.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
            poVar7 = std::operator<<(poVar7,(string *)psVar5);
            std::operator<<(poVar7,"\".\n");
            std::__cxx11::ostringstream::str();
            cmSystemTools::Error(&local_3a8);
            std::__cxx11::string::~string((string *)&local_3a8);
            report.field_2._12_4_ = 2;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_388);
          }
          else {
            std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&consistent);
            report.field_2._12_4_ = 3;
          }
          std::
          pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_1f0);
        }
        else {
          report.field_2._12_4_ = 3;
        }
      }
      else if (bVar3) {
        std::__cxx11::string::string
                  ((string *)(consistent_1.second.field_2._M_local_buf + 8),
                   (string *)__return_storage_ptr__);
        impliedValue<std::__cxx11::string>
                  (&local_3c8,(string *)((long)&consistent_1.second.field_2 + 8));
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_3c8);
        std::__cxx11::string::~string((string *)&local_3c8);
        std::__cxx11::string::~string((string *)(consistent_1.second.field_2._M_local_buf + 8));
        if (bVar4) {
          consistentProperty((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_410,__return_storage_ptr__,
                             (string *)((long)&reportEntry.field_2 + 8),
                             headPropKeys.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          std::__cxx11::string::operator+=((string *)local_90,(string *)local_188);
          CVar1 = headPropKeys.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          bVar4 = std::operator!=(__return_storage_ptr__,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&consistent_1);
          compatibilityAgree_abi_cxx11_(&local_430,CVar1,bVar4);
          std::__cxx11::string::operator+=((string *)local_90,(string *)&local_430);
          std::__cxx11::string::~string((string *)&local_430);
          if ((local_410[0] & 1U) == 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5a8);
            poVar7 = std::operator<<((ostream *)local_5a8,"Property ");
            poVar7 = std::operator<<(poVar7,(string *)p);
            poVar7 = std::operator<<(poVar7," on target \"");
            psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
            poVar7 = std::operator<<(poVar7,(string *)psVar5);
            poVar7 = std::operator<<(poVar7,"\" is\nimplied to be ");
            poVar7 = std::operator<<(poVar7,defaultValue);
            poVar7 = std::operator<<(poVar7,
                                     " because it was used to determine the link libraries\nalready. The INTERFACE_"
                                    );
            poVar7 = std::operator<<(poVar7,(string *)p);
            poVar7 = std::operator<<(poVar7," property on\ndependency \"");
            psVar5 = cmGeneratorTarget::GetName_abi_cxx11_
                               ((cmGeneratorTarget *)
                                propKeys.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
            poVar7 = std::operator<<(poVar7,(string *)psVar5);
            std::operator<<(poVar7,"\" is in conflict.\n");
            std::__cxx11::ostringstream::str();
            cmSystemTools::Error((string *)((long)&consistent_2.second.field_2 + 8));
            std::__cxx11::string::~string((string *)(consistent_2.second.field_2._M_local_buf + 8));
            report.field_2._12_4_ = 2;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5a8);
          }
          else {
            std::__cxx11::string::operator=
                      ((string *)__return_storage_ptr__,(string *)&consistent_1);
            report.field_2._12_4_ = 3;
          }
          std::
          pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_410);
        }
        else {
          report.field_2._12_4_ = 3;
        }
      }
      else if (bVar4) {
        if ((report.field_2._M_local_buf[0xb] & 1U) == 0) {
          std::operator+(&local_7c8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_188,"(Interface set)\n");
          std::__cxx11::string::operator+=((string *)local_90,(string *)&local_7c8);
          std::__cxx11::string::~string((string *)&local_7c8);
          std::__cxx11::string::operator=
                    ((string *)__return_storage_ptr__,
                     (string *)(reportEntry.field_2._M_local_buf + 8));
          report.field_2._M_local_buf[0xb] = '\x01';
          report.field_2._12_4_ = 0;
        }
        else {
          consistentProperty((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_5f0,__return_storage_ptr__,
                             (string *)((long)&reportEntry.field_2 + 8),
                             headPropKeys.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          std::__cxx11::string::operator+=((string *)local_90,(string *)local_188);
          CVar1 = headPropKeys.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          bVar4 = std::operator!=(__return_storage_ptr__,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&consistent_2);
          compatibilityAgree_abi_cxx11_(&local_610,CVar1,bVar4);
          std::__cxx11::string::operator+=((string *)local_90,(string *)&local_610);
          std::__cxx11::string::~string((string *)&local_610);
          if ((local_5f0[0] & 1U) == 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_788);
            poVar7 = std::operator<<((ostream *)local_788,"The INTERFACE_");
            poVar7 = std::operator<<(poVar7,(string *)p);
            poVar7 = std::operator<<(poVar7," property of \"");
            psVar5 = cmGeneratorTarget::GetName_abi_cxx11_
                               ((cmGeneratorTarget *)
                                propKeys.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
            poVar7 = std::operator<<(poVar7,(string *)psVar5);
            poVar7 = std::operator<<(poVar7,"\" does\nnot agree with the value of ");
            poVar7 = std::operator<<(poVar7,(string *)p);
            poVar7 = std::operator<<(poVar7," already determined\nfor \"");
            psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
            poVar7 = std::operator<<(poVar7,(string *)psVar5);
            std::operator<<(poVar7,"\".\n");
            std::__cxx11::ostringstream::str();
            cmSystemTools::Error(&local_7a8);
            std::__cxx11::string::~string((string *)&local_7a8);
            report.field_2._12_4_ = 2;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_788);
          }
          else {
            std::__cxx11::string::operator=
                      ((string *)__return_storage_ptr__,(string *)&consistent_2);
            report.field_2._12_4_ = 3;
          }
          std::
          pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_5f0);
        }
      }
      else {
        report.field_2._12_4_ = 3;
      }
      std::__cxx11::string::~string((string *)local_188);
      std::__cxx11::string::~string((string *)(reportEntry.field_2._M_local_buf + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_140);
      if ((report.field_2._12_4_ != 0) && (report.field_2._12_4_ == 2)) break;
      __gnu_cxx::
      __normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
      ::operator++(&__end1);
    }
    std::__cxx11::string::string((string *)&local_808,(string *)__return_storage_ptr__);
    valueAsString<std::__cxx11::string>(&local_7e8,&local_808);
    compatibilityType_abi_cxx11_
              (&local_828,
               headPropKeys.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    cmGeneratorTarget::ReportPropertyOrigin(tgt,p,&local_7e8,(string *)local_90,&local_828);
    std::__cxx11::string::~string((string *)&local_828);
    std::__cxx11::string::~string((string *)&local_7e8);
    std::__cxx11::string::~string((string *)&local_808);
    headPropKeys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
    report.field_2._12_4_ = 1;
    std::
    unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
    ::~unique_ptr(&local_f8);
    std::__cxx11::string::~string((string *)&genexInterpreter);
    std::__cxx11::string::~string((string *)local_90);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  if ((headPropKeys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmGeneratorTarget const* tgt,
                                                 const std::string& p,
                                                 const std::string& config,
                                                 const char* defaultValue,
                                                 CompatibleType t,
                                                 PropertyType* /*unused*/)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);

  std::vector<std::string> headPropKeys = tgt->GetPropertyKeys();
  const bool explicitlySet = cm::contains(headPropKeys, p);

  const bool impliedByUse = tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet));

  std::vector<cmGeneratorTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if (deps.empty()) {
    return propContent;
  }
  bool propInitialized = explicitlySet;

  std::string report = cmStrCat(" * Target \"", tgt->GetName());
  if (explicitlySet) {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
  } else if (impliedByUse) {
    report += "\" property is implied by use.\n";
  } else {
    report += "\" property not set.\n";
  }

  std::string interfaceProperty = "INTERFACE_" + p;
  std::unique_ptr<cmGeneratorExpressionInterpreter> genexInterpreter;
  if (p == "POSITION_INDEPENDENT_CODE") {
    genexInterpreter = cm::make_unique<cmGeneratorExpressionInterpreter>(
      tgt->GetLocalGenerator(), config, tgt);
  }

  for (cmGeneratorTarget const* theTarget : deps) {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    std::vector<std::string> propKeys = theTarget->GetPropertyKeys();

    const bool ifaceIsSet = cm::contains(propKeys, interfaceProperty);
    PropertyType ifacePropContent = getTypedProperty<PropertyType>(
      theTarget, interfaceProperty, genexInterpreter.get());

    std::string reportEntry;
    if (ifaceIsSet) {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
    }

    if (explicitlySet) {
      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" does\nnot match the "
               "INTERFACE_"
            << p
            << " property requirement\nof "
               "dependency \""
            << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Explicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (impliedByUse) {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_"
            << p << " property on\ndependency \"" << theTarget->GetName()
            << "\" is in conflict.\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Implicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (ifaceIsSet) {
      if (propInitialized) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "The INTERFACE_" << p << " property of \""
            << theTarget->GetName() << "\" does\nnot agree with the value of "
            << p << " already determined\nfor \"" << tgt->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      report += reportEntry + "(Interface set)\n";
      propContent = ifacePropContent;
      propInitialized = true;
    } else {
      // Not set. Nothing to agree on.
      continue;
    }
  }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}